

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

char mcplcfg_decode_modeflag(char *flag)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *in_RDI;
  char local_1;
  
  if (*in_RDI == '-') {
    pcVar2 = in_RDI + 1;
    if (*pcVar2 == '-') {
      pcVar2 = in_RDI + 2;
      if ((*pcVar2 == 's') && (iVar1 = strncmp(pcVar2,"show",5), iVar1 == 0)) {
        local_1 = 's';
      }
      else if ((*pcVar2 == 'v') && (iVar1 = strncmp(pcVar2,"version",8), iVar1 == 0)) {
        local_1 = 'v';
      }
      else if ((*pcVar2 == 'i') && (iVar1 = strncmp(pcVar2,"intversion",0xb), iVar1 == 0)) {
        local_1 = 'i';
      }
      else if ((*pcVar2 == 's') && (iVar1 = strncmp(pcVar2,"summary",8), iVar1 == 0)) {
        local_1 = 'u';
      }
      else if ((*pcVar2 == 'h') && (iVar1 = strncmp(pcVar2,"help",5), iVar1 == 0)) {
        local_1 = 'h';
      }
      else {
        local_1 = '\0';
      }
    }
    else {
      sVar3 = strlen(pcVar2);
      if (sVar3 == 1) {
        switch(*pcVar2) {
        case 'h':
          local_1 = 'h';
          break;
        case 'i':
          local_1 = 'i';
          break;
        default:
          local_1 = '\0';
          break;
        case 's':
          local_1 = 'u';
          break;
        case 'v':
          local_1 = 'v';
        }
      }
      else {
        local_1 = '\0';
      }
    }
  }
  else {
    local_1 = '\0';
  }
  return local_1;
}

Assistant:

char mcplcfg_decode_modeflag( const char* flag )
{
  //Decode primary mode flag
#define MCPLCFG_MODE_HELP 'h'
#define MCPLCFG_MODE_VERSION 'v'
#define MCPLCFG_MODE_INTVERSION 'i'
#define MCPLCFG_MODE_SUMMARY 'u'
#define MCPLCFG_MODE_SHOW 's'
#define MCPLCFG_MODE_INVALID '\0'
  if ( flag[0] != '-' )
    return MCPLCFG_MODE_INVALID;
  ++flag;
  if ( flag[0] == '-' ) {
    //long option
    ++flag;
#define MCPLCFG_STREQUALCONST(a,b) (a[0]==b[0] && strncmp(a,b,sizeof(b))==0)
#define MCPLCFG_STREQUAL(a,b) (a[0]==b[0] && strcmp(a,b)==0)

    if ( MCPLCFG_STREQUALCONST( flag, "show" ) )
      return MCPLCFG_MODE_SHOW;

    if ( MCPLCFG_STREQUALCONST( flag, "version" ) )
      return MCPLCFG_MODE_VERSION;

    if ( MCPLCFG_STREQUALCONST( flag, "intversion" ) )
      return MCPLCFG_MODE_INTVERSION;

    if ( MCPLCFG_STREQUALCONST( flag, "summary" ) )
      return MCPLCFG_MODE_SUMMARY;

    if ( MCPLCFG_STREQUALCONST( flag, "help" ) )
      return MCPLCFG_MODE_HELP;

    return MCPLCFG_MODE_INVALID;
  } else {
    //short option
    if (strlen(flag)!=1)
      return MCPLCFG_MODE_INVALID;
    switch( flag[0] ) {
    case 'h': return MCPLCFG_MODE_HELP;
    case 'v': return MCPLCFG_MODE_VERSION;
    case 'i': return MCPLCFG_MODE_INTVERSION;
    case 's': return MCPLCFG_MODE_SUMMARY;
    default:
      return MCPLCFG_MODE_INVALID;
    }
  }
}